

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void shld_EvGvCL(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  (pMyDisasm->Instruction).Category = 0x10004;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"shld",5);
  EvGv(pMyDisasm);
  strcpy((pMyDisasm->Operand3).OpMnemonic,Registers8Bits[1]);
  (pMyDisasm->Operand3).OpType = 0x20000;
  (pMyDisasm->Operand3).Registers.type = 1;
  (pMyDisasm->Operand3).Registers.gpr = 2;
  (pMyDisasm->Operand3).OpSize = 8;
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar3 = EFLAGS_TABLE[0x61].SF_;
  UVar4 = EFLAGS_TABLE[0x61].ZF_;
  UVar5 = EFLAGS_TABLE[0x61].AF_;
  UVar6 = EFLAGS_TABLE[0x61].PF_;
  UVar7 = EFLAGS_TABLE[0x61].CF_;
  UVar8 = EFLAGS_TABLE[0x61].TF_;
  UVar9 = EFLAGS_TABLE[0x61].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x61].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar3;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar4;
  (pMyDisasm->Instruction).Flags.AF_ = UVar5;
  (pMyDisasm->Instruction).Flags.PF_ = UVar6;
  (pMyDisasm->Instruction).Flags.CF_ = UVar7;
  (pMyDisasm->Instruction).Flags.TF_ = UVar8;
  (pMyDisasm->Instruction).Flags.IF_ = UVar9;
  UVar3 = EFLAGS_TABLE[0x61].NT_;
  UVar4 = EFLAGS_TABLE[0x61].RF_;
  UVar5 = EFLAGS_TABLE[0x61].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x61].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar3;
  (pMyDisasm->Instruction).Flags.RF_ = UVar4;
  (pMyDisasm->Instruction).Flags.alignment = UVar5;
  return;
}

Assistant:

void __bea_callspec__ shld_EvGvCL(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }

  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+SHIFT_ROTATE;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "shld");
  #endif
  EvGv(pMyDisasm);
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Operand3.OpMnemonic, Registers8Bits[1]);
  #endif
  pMyDisasm->Operand3.OpType = REGISTER_TYPE;
  pMyDisasm->Operand3.Registers.type = GENERAL_REG;
  pMyDisasm->Operand3.Registers.gpr = REG1;
  pMyDisasm->Operand3.OpSize = 8;
  FillFlags(pMyDisasm, 97);
}